

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall
capnp::JsonCodec::AnnotatedEnumHandler::AnnotatedEnumHandler
          (AnnotatedEnumHandler *this,EnumSchema schema)

{
  ListElementCount LVar1;
  ulong count;
  ArrayPtr<const_char> key;
  ArrayBuilder<kj::StringPtr> builder;
  Reader proto;
  Enumerant e;
  Reader anno;
  EnumerantList enumerants;
  ArrayBuilder<kj::StringPtr> local_1c8;
  Array<kj::StringPtr> *local_1a0;
  HashMap<kj::StringPtr,_unsigned_short> *local_198;
  IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
  local_190;
  IndexingIterator<const_capnp::EnumSchema::EnumerantList,_capnp::EnumSchema::Enumerant> local_180;
  Schema local_170;
  Reader local_168;
  Enumerant local_138;
  Reader local_f8;
  EnumerantList local_c8;
  Reader local_90;
  Reader local_60;
  
  (this->super_Handler<capnp::DynamicEnum,_(capnp::Style)0>).super_HandlerBase._vptr_HandlerBase =
       (_func_int **)&PTR_encodeBase_00275618;
  (this->schema).super_Schema.raw = (RawBrandedSchema *)schema.super_Schema.raw;
  local_1a0 = &this->valueToName;
  local_198 = &this->nameToValue;
  (this->valueToName).ptr = (StringPtr *)0x0;
  (this->valueToName).size_ = 0;
  (this->valueToName).disposer = (ArrayDisposer *)0x0;
  (this->nameToValue).table.rows.builder.ptr = (Entry *)0x0;
  (this->nameToValue).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> *)0x0;
  (this->nameToValue).table.rows.builder.endPtr = (Entry *)0x0;
  (this->nameToValue).table.rows.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (this->nameToValue).table.indexes.erasedCount = 0;
  (this->nameToValue).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (this->nameToValue).table.indexes.buckets.size_ = 0;
  (this->nameToValue).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  local_170 = schema.super_Schema.raw;
  EnumSchema::getEnumerants(&local_c8,(EnumSchema *)&local_170);
  count = (ulong)local_c8.list.reader.elementCount;
  local_1c8.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringPtr>(count);
  local_1c8.endPtr = (StringPtr *)(&((RawBrandedSchema *)local_1c8.ptr)->generic + count * 2);
  local_1c8.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_1c8.pos = local_1c8.ptr;
  local_180.container = &local_c8;
  for (local_180.index = 0; local_180.index != local_c8.list.reader.elementCount;
      local_180.index = local_180.index + 1) {
    capnp::_::IndexingIterator<const_capnp::EnumSchema::EnumerantList,_capnp::EnumSchema::Enumerant>
    ::operator*(&local_138,&local_180);
    local_168._reader.dataSize = local_138.proto._reader.dataSize;
    local_168._reader.pointerCount = local_138.proto._reader.pointerCount;
    local_168._reader._38_2_ = local_138.proto._reader._38_2_;
    local_168._reader.nestingLimit = local_138.proto._reader.nestingLimit;
    local_168._reader._44_4_ = local_138.proto._reader._44_4_;
    local_168._reader.data = local_138.proto._reader.data;
    local_168._reader.pointers = local_138.proto._reader.pointers;
    local_168._reader.segment = local_138.proto._reader.segment;
    local_168._reader.capTable = local_138.proto._reader.capTable;
    key = (ArrayPtr<const_char>)capnp::schema::Enumerant::Reader::getName(&local_168);
    capnp::schema::Enumerant::Reader::getAnnotations(&local_90,&local_168);
    LVar1 = local_90.reader.elementCount;
    local_190.container = &local_90;
    for (local_190.index = 0; local_190.index != LVar1; local_190.index = local_190.index + 1) {
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
      ::operator*(&local_f8,&local_190);
      if ((0x3f < local_f8._reader.dataSize) && (*local_f8._reader.data == -0x5a4e029e3d183c3)) {
        capnp::schema::Annotation::Reader::getValue(&local_60,&local_f8);
        key = (ArrayPtr<const_char>)capnp::schema::Value::Reader::getText(&local_60);
      }
    }
    *local_1c8.pos = (RemoveConst<kj::StringPtr>)key;
    local_1c8.pos = (RemoveConst<kj::StringPtr> *)((long)local_1c8.pos + 0x10);
    kj::HashMap<kj::StringPtr,_unsigned_short>::insert(local_198,(StringPtr)key,local_138.ordinal);
  }
  local_138._8_8_ = (long)local_1c8.pos - (long)local_1c8.ptr >> 4;
  local_138.parent.super_Schema.raw = (Schema)(Schema)local_1c8.ptr;
  local_138.proto._reader.segment = (SegmentReader *)local_1c8.disposer;
  local_1c8.ptr = (StringPtr *)0x0;
  local_1c8.pos = (RemoveConst<kj::StringPtr> *)0x0;
  local_1c8.endPtr = (StringPtr *)0x0;
  kj::Array<kj::StringPtr>::operator=(local_1a0,(Array<kj::StringPtr> *)&local_138);
  kj::Array<kj::StringPtr>::~Array((Array<kj::StringPtr> *)&local_138);
  kj::ArrayBuilder<kj::StringPtr>::dispose(&local_1c8);
  return;
}

Assistant:

AnnotatedEnumHandler(EnumSchema schema): schema(schema) {
    auto enumerants = schema.getEnumerants();
    auto builder = kj::heapArrayBuilder<kj::StringPtr>(enumerants.size());

    for (auto e: enumerants) {
      auto proto = e.getProto();
      kj::StringPtr name = proto.getName();

      for (auto anno: proto.getAnnotations()) {
        switch (anno.getId()) {
          case JSON_NAME_ANNOTATION_ID:
            name = anno.getValue().getText();
            break;
        }
      }

      builder.add(name);
      nameToValue.insert(name, e.getIndex());
    }

    valueToName = builder.finish();
  }